

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageControl::mouseReleaseEvent(PageControl *this,QMouseEvent *e)

{
  PageControlPrivate *pPVar1;
  QMouseEvent QVar2;
  int iVar3;
  int iVar4;
  QPoint QVar5;
  int iVar6;
  QPoint local_28;
  
  if (*(int *)(e + 0x40) == 1) {
    if (((this->d).d)->leftButtonPressed == true) {
      QVar5 = QMouseEvent::pos(e);
      pPVar1 = (this->d).d;
      iVar3 = QVar5.xp - (pPVar1->clickPos).xp;
      iVar6 = QVar5.yp - (pPVar1->clickPos).yp;
      iVar4 = -iVar3;
      if (0 < iVar3) {
        iVar4 = iVar3;
      }
      iVar3 = -iVar6;
      if (0 < iVar6) {
        iVar3 = iVar6;
      }
      iVar6 = FingerGeometry::touchBounce();
      if (iVar3 + iVar4 <= iVar6) {
        pPVar1 = (this->d).d;
        local_28 = QMouseEvent::pos(e);
        iVar4 = PageControlPrivate::findButton(pPVar1,&local_28);
        if (-1 < iVar4) {
          setCurrentIndex(this,iVar4);
        }
      }
    }
    ((this->d).d)->leftButtonPressed = false;
    QVar2 = (QMouseEvent)0x1;
  }
  else {
    QVar2 = (QMouseEvent)0x0;
  }
  e[0xc] = QVar2;
  return;
}

Assistant:

void
PageControl::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			const QPoint pos = e->pos() - d->clickPos;

			if( pos.manhattanLength() <= FingerGeometry::touchBounce() )
			{
				const int index = d->findButton( e->pos() );

				if( index >= 0 )
					setCurrentIndex( index );
			}
		}

		d->leftButtonPressed = false;

		e->accept();
	}
	else
		e->ignore();
}